

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O3

void google::protobuf::StrAppend(string *result,AlphaNum *a,AlphaNum *b,AlphaNum *c,AlphaNum *d)

{
  size_type sVar1;
  size_t sVar2;
  pointer pcVar3;
  
  sVar1 = result->_M_string_length;
  std::__cxx11::string::resize
            ((ulong)result,
             (char)a->piece_size_ + (char)sVar1 + (char)b->piece_size_ + (char)c->piece_size_ +
             (char)d->piece_size_);
  pcVar3 = (result->_M_dataplus)._M_p + sVar1;
  memcpy(pcVar3,a->piece_data_,a->piece_size_);
  pcVar3 = pcVar3 + a->piece_size_;
  memcpy(pcVar3,b->piece_data_,b->piece_size_);
  sVar2 = b->piece_size_;
  memcpy(pcVar3 + sVar2,c->piece_data_,c->piece_size_);
  memcpy(pcVar3 + sVar2 + c->piece_size_,d->piece_data_,d->piece_size_);
  return;
}

Assistant:

void StrAppend(string *result,
               const AlphaNum &a, const AlphaNum &b,
               const AlphaNum &c, const AlphaNum &d) {
  GOOGLE_DCHECK_NO_OVERLAP(*result, a);
  GOOGLE_DCHECK_NO_OVERLAP(*result, b);
  GOOGLE_DCHECK_NO_OVERLAP(*result, c);
  GOOGLE_DCHECK_NO_OVERLAP(*result, d);
  string::size_type old_size = result->size();
  result->resize(old_size + a.size() + b.size() + c.size() + d.size());
  char *const begin = &*result->begin();
  char *out = Append4(begin + old_size, a, b, c, d);
  GOOGLE_DCHECK_EQ(out, begin + result->size());
}